

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UniqueRenderResource.h
# Opt level: O1

void __thiscall
Rml::UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
::ReleaseInDerived(UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
                   *this)

{
  void *local_38 [2];
  long local_28;
  void *local_20;
  long local_10;
  
  Rml::Geometry::Release((ReleaseMode)local_38);
  if (local_20 != (void *)0x0) {
    operator_delete(local_20,local_10 - (long)local_20);
  }
  if (local_38[0] != (void *)0x0) {
    operator_delete(local_38[0],local_28 - (long)local_38[0]);
  }
  return;
}

Assistant:

void MoveFrom(UniqueRenderResource& other) noexcept
	{
		render_manager = std::exchange(other.render_manager, nullptr);
		resource_handle = std::exchange(other.resource_handle, InvalidHandleValue);
	}